

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSha256.cpp
# Opt level: O2

void testSha256(void)

{
  code *pcVar1;
  int iVar2;
  byte checksum [32];
  byte check2 [32];
  byte check1 [32];
  
  check1[0x10] = '\'';
  check1[0x11] = 0xae;
  check1[0x12] = 'A';
  check1[0x13] = 0xe4;
  check1[0x14] = 'd';
  check1[0x15] = 0x9b;
  check1[0x16] = 0x93;
  check1[0x17] = 'L';
  check1[0x18] = 0xa4;
  check1[0x19] = 0x95;
  check1[0x1a] = 0x99;
  check1[0x1b] = '\x1b';
  check1[0x1c] = 'x';
  check1[0x1d] = 'R';
  check1[0x1e] = 0xb8;
  check1[0x1f] = 'U';
  check1[0] = 0xe3;
  check1[1] = 0xb0;
  check1[2] = 0xc4;
  check1[3] = 'B';
  check1[4] = 0x98;
  check1[5] = 0xfc;
  check1[6] = '\x1c';
  check1[7] = '\x14';
  check1[8] = 0x9a;
  check1[9] = 0xfb;
  check1[10] = 0xf4;
  check1[0xb] = 200;
  check1[0xc] = 0x99;
  check1[0xd] = 'o';
  check1[0xe] = 0xb9;
  check1[0xf] = '$';
  Sha256::hash("",0,&checksum);
  iVar2 = Memory::compare(checksum,check1,0x20);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestSha256.cpp"
                          ,0xc,"Memory::compare(checksum, check1, sizeof(check1)) == 0");
    if (iVar2 != 0) goto LAB_00102642;
  }
  check2[0x10] = 0xa9;
  check2[0x11] = 0xba;
  check2[0x12] = 0x93;
  check2[0x13] = 0xfb;
  check2[0x14] = '\x05';
  check2[0x15] = '~';
  check2[0x16] = '\x14';
  check2[0x17] = 0x9c;
  check2[0x18] = 0x96;
  check2[0x19] = 0xca;
  check2[0x1a] = 0x82;
  check2[0x1b] = 'm';
  check2[0x1c] = 0xe7;
  check2[0x1d] = 'z';
  check2[0x1e] = 'P';
  check2[0x1f] = 0xa8;
  check2[0] = '\\';
  check2[1] = 0x93;
  check2[2] = '\x0f';
  check2[3] = 0xbe;
  check2[4] = 'j';
  check2[5] = 'M';
  check2[6] = 0x8d;
  check2[7] = 0x87;
  check2[8] = 0xd8;
  check2[9] = 0x98;
  check2[10] = '[';
  check2[0xb] = '-';
  check2[0xc] = '(';
  check2[0xd] = 0xad;
  check2[0xe] = 'k';
  check2[0xf] = '0';
  Sha256::hash((byte *)"But First, We Need to Talk About Parallel Universes",0x33,&checksum);
  iVar2 = Memory::compare(checksum,check2,0x20);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestSha256.cpp"
                          ,0x11,"Memory::compare(checksum, check2, sizeof(check2)) == 0");
    if (iVar2 != 0) {
LAB_00102642:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void testSha256()
{
  byte check1[Sha256::digestSize] = {
    0xe3, 0xb0, 0xc4, 0x42, 0x98, 0xfc, 0x1c, 0x14, 0x9a, 0xfb, 0xf4, 0xc8, 0x99, 0x6f, 0xb9, 0x24, 0x27, 0xae, 0x41, 0xe4, 0x64, 0x9b, 0x93, 0x4c, 0xa4, 0x95, 0x99, 0x1b, 0x78, 0x52, 0xb8, 0x55
  };
  byte checksum[Sha256::digestSize];
  Sha256::hash((const byte*)"", 0, checksum);
  ASSERT(Memory::compare(checksum, check1, sizeof(check1)) == 0);
  byte check2[Sha256::digestSize] = {
    0x5c, 0x93, 0x0f, 0xbe, 0x6a, 0x4d, 0x8d, 0x87, 0xd8, 0x98, 0x5b, 0x2d, 0x28, 0xad, 0x6b, 0x30, 0xa9, 0xba, 0x93, 0xfb, 0x05, 0x7e, 0x14, 0x9c, 0x96, 0xca, 0x82, 0x6d, 0xe7, 0x7a, 0x50, 0xa8
  };
  Sha256::hash((const byte*)"But First, We Need to Talk About Parallel Universes", 51, checksum);
  ASSERT(Memory::compare(checksum, check2, sizeof(check2)) == 0);
}